

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

void __thiscall
Abstract<4U>::Check(Abstract<4U> *this,HashMap<4U> *mp,count_type HIT,
                   vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   *outs)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  undefined8 uVar4;
  const_reference ppbVar5;
  ostream *poVar6;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RCX;
  int in_EDX;
  long *in_RDI;
  double rt;
  double pr;
  double cr;
  double are;
  double aae;
  count_type flagtrue;
  count_type size;
  count_type hit;
  count_type all;
  count_type value;
  const_iterator it;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffff28;
  _Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *in_stack_ffffffffffffff30;
  double dVar7;
  double local_b8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_78;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_70;
  undefined8 local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_28;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_20;
  int local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x111160);
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0;
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_ffffffffffffff28);
  local_28._M_cur = local_70._M_cur;
  while( true ) {
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_ffffffffffffff28);
    bVar1 = std::__detail::operator!=(&local_28,&local_78);
    if (!bVar1) break;
    pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                        0x11122b);
    local_2c = (**(code **)(*in_RDI + 0x18))(in_RDI,pvVar3);
    pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                        0x11124d);
    if (local_14 < pvVar3->second) {
      local_30 = local_30 + 1;
      if (local_2c < 0) {
        local_2c = -local_2c;
        local_3c = local_3c + 1;
      }
      if (local_14 < local_2c) {
        local_34 = local_34 + 1;
        pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                            0x1112cb);
        iVar2 = pvVar3->second - local_2c;
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        local_48 = (double)iVar2 + local_48;
        pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                            0x1112ff);
        iVar2 = pvVar3->second - local_2c;
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                            0x111327);
        local_50 = (double)iVar2 / (double)pvVar3->second + local_50;
      }
    }
    if (local_14 < local_2c) {
      local_38 = local_38 + 1;
    }
    std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              (in_stack_ffffffffffffff30);
  }
  local_48 = local_48 / (double)local_34;
  local_50 = local_50 / (double)local_34;
  local_58 = (double)local_34 / (double)local_30;
  local_60 = (double)local_34 / (double)local_38;
  uVar4 = std::__cxx11::string::c_str();
  if (1e-06 <= local_58 + local_60) {
    local_b8 = local_58 + local_60;
  }
  else {
    local_b8 = 1.0;
  }
  printf("%s:\tARE: %f\tCR: %f\tPR: %f\tF1: %f\n",local_50,local_58,local_60,
         (local_60 * 2.0 * local_58) / local_b8,uVar4);
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,0);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar5,local_50);
  std::operator<<(poVar6,",");
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar5,local_58);
  std::operator<<(poVar6,",");
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar5,local_60);
  std::operator<<(poVar6,",");
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,3);
  if (1e-06 <= local_58 + local_60) {
    dVar7 = local_58 + local_60;
  }
  else {
    dVar7 = 1.0;
  }
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)*ppbVar5,(local_60 * 2.0 * local_58) / dVar7);
  std::operator<<(poVar6,",");
  return;
}

Assistant:

void Check(const HashMap<DATA_LEN>& mp, count_type HIT, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::const_iterator it;
		count_type value = 0, all = 0, hit = 0, size = 0, flagtrue = 0;
		double aae = 0, are = 0, cr = 0, pr = 0, rt = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = QueryTopK(it->first);
			if (it->second > HIT) {
				all++;
				if (value < 0) {
					value = -value;
					flagtrue += 1;
				}
				if (value > HIT) {
					hit += 1;
					aae += abs(it->second - value);
					are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > HIT)
			{
				size += 1;
			}
		}

		aae /= hit;
		are /= hit;
		cr = hit / (double)all;
		pr = hit / (double)size;

		printf(
			"%s:\tARE: %f\tCR: %f\tPR: %f\tF1: %f\n",
			name.c_str(), are, cr, pr, 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr));
		*outs[0] << are << ",";
		*outs[1] << cr << ",";
		*outs[2] << pr << ",";
		*outs[3] << 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr) << ",";
	}